

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  uint32_t hash;
  uint uVar1;
  LRUHandle *e;
  Mutex *__mutex;
  
  hash = HashSlice(key);
  uVar1 = hash >> 0x1c;
  __mutex = &this->shard_[uVar1].mutex_;
  std::mutex::lock(&__mutex->mu_);
  e = HandleTable::Remove(&this->shard_[uVar1].table_,key,hash);
  LRUCache::FinishErase(this->shard_ + uVar1,e);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }